

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O0

void __thiscall QGraphicsWidget::setAttribute(QWindow *this,WidgetAttribute attribute,bool on)

{
  bool value;
  byte in_DL;
  WidgetAttribute in_ESI;
  QGraphicsWidgetPrivate *in_RDI;
  QGraphicsWidgetPrivate *d;
  
  value = (bool)(in_DL & 1);
  d_func((QGraphicsWidget *)0xa4b643);
  QGraphicsWidgetPrivate::setAttribute(in_RDI,in_ESI,value);
  return;
}

Assistant:

void QGraphicsWidget::setAttribute(Qt::WidgetAttribute attribute, bool on)
{
    Q_D(QGraphicsWidget);
    // ### most flags require some immediate action
    // ### we might want to qWarn use of unsupported attributes
    // ### we might want to not use Qt::WidgetAttribute, but roll our own instead
    d->setAttribute(attribute, on);
}